

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

bstring bjoinblk(bstrList *bl,void *blk,int len)

{
  uint uVar1;
  bstring *pptVar2;
  int iVar3;
  bstring ptVar4;
  uchar *puVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uchar *__dest;
  
  if (bl != (bstrList *)0x0) {
    uVar1 = bl->qty;
    uVar8 = (ulong)uVar1;
    if ((-1 < (int)(uVar1 | len)) && (blk != (void *)0x0 || len == 0)) {
      if (uVar8 == 0) {
        ptVar4 = blk2bstr(anon_var_dwarf_2ab63 + 0x10,0);
        return ptVar4;
      }
      if ((int)uVar1 < 1) {
        uVar10 = 1;
      }
      else {
        uVar10 = 1;
        uVar6 = 0;
        do {
          iVar3 = bl->entry[uVar6]->slen;
          if (iVar3 < 0) {
            return (bstring)0x0;
          }
          if ((int)(uVar10 ^ 0x7fffffff) < iVar3) {
            return (bstring)0x0;
          }
          uVar10 = uVar10 + iVar3;
          uVar6 = uVar6 + 1;
        } while (uVar8 != uVar6);
      }
      ptVar4 = (bstring)malloc(0x10);
      if (len == 0) {
        puVar5 = (uchar *)malloc((ulong)uVar10);
        ptVar4->data = puVar5;
        if (puVar5 != (uchar *)0x0) {
          if (0 < (int)uVar1) {
            pptVar2 = bl->entry;
            uVar6 = 0;
            __dest = puVar5;
            do {
              sVar7 = (size_t)pptVar2[uVar6]->slen;
              memcpy(__dest,pptVar2[uVar6]->data,sVar7);
              __dest = __dest + sVar7;
              uVar6 = uVar6 + 1;
            } while (uVar8 != uVar6);
          }
LAB_00136819:
          ptVar4->mlen = uVar10;
          ptVar4->slen = uVar10 - 1;
          puVar5[(long)(int)uVar10 + -1] = '\0';
          return ptVar4;
        }
      }
      else {
        iVar3 = (uVar1 - 1) * len;
        if (iVar3 <= (int)(uVar10 ^ 0x7fffffff)) {
          uVar10 = uVar10 + iVar3;
          puVar5 = (uchar *)malloc((long)(int)uVar10);
          ptVar4->data = puVar5;
          if (puVar5 != (uchar *)0x0) {
            sVar7 = (size_t)(*bl->entry)->slen;
            memcpy(puVar5,(*bl->entry)->data,sVar7);
            if (1 < (int)uVar1) {
              puVar5 = puVar5 + sVar7;
              lVar9 = 1;
              do {
                memcpy(puVar5,blk,(ulong)(uint)len);
                puVar5 = puVar5 + (uint)len;
                sVar7 = (size_t)bl->entry[lVar9]->slen;
                if (sVar7 != 0) {
                  memcpy(puVar5,bl->entry[lVar9]->data,sVar7);
                  puVar5 = puVar5 + sVar7;
                }
                lVar9 = lVar9 + 1;
              } while (lVar9 < bl->qty);
              puVar5 = ptVar4->data;
            }
            goto LAB_00136819;
          }
        }
      }
      free(ptVar4);
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring bjoinblk (const struct bstrList * bl, const void * blk, int len) {
bstring b;
unsigned char * p;
int i, c, v;

	if (bl == NULL || bl->qty < 0) return NULL;
	if (len < 0) return NULL;
	if (len > 0 && blk == NULL) return NULL;
	if (bl->qty < 1) return bfromStatic ("");

	for (i = 0, c = 1; i < bl->qty; i++) {
		v = bl->entry[i]->slen;
		if (v < 0) return NULL;	/* Invalid input */
		if (v > INT_MAX - c) return NULL;	/* Overflow */
		c += v;
	}

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (len == 0) {
		p = b->data = (unsigned char *) bstr__alloc (c);
		if (p == NULL) {
			bstr__free (b);
			return NULL;
		}
		for (i = 0; i < bl->qty; i++) {
			v = bl->entry[i]->slen;
			bstr__memcpy (p, bl->entry[i]->data, v);
			p += v;
		}
	} else {
		v = (bl->qty - 1) * len;
		if ((bl->qty > 512 || len > 127) &&
			v / len != bl->qty - 1) {
			bstr__free (b);
			return NULL; /* Overflow */
		}
		if (v > INT_MAX - c) {
			bstr__free (b);
			return NULL;    /* Overflow */
		}
		c += v;
		p = b->data = (unsigned char *) bstr__alloc (c);
		if (p == NULL) {
			bstr__free (b);
			return NULL;
		}
		v = bl->entry[0]->slen;
		bstr__memcpy (p, bl->entry[0]->data, v);
		p += v;
		for (i = 1; i < bl->qty; i++) {
			bstr__memcpy (p, blk, len);
			p += len;
			v = bl->entry[i]->slen;
			if (v) {
				bstr__memcpy (p, bl->entry[i]->data, v);
				p += v;
			}
		}
	}
	b->mlen = c;
	b->slen = c-1;
	b->data[c-1] = (unsigned char) '\0';
	return b;
}